

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets
          (cmGlobalGenerator *this,TargetTypes targetTypes,cmMakefile *mf,cmLocalGenerator *lg,
          map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *importedMap)

{
  const_iterator cVar1;
  cmGeneratorTarget *this_00;
  __node_base *p_Var2;
  pointer __k;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> itgts;
  _Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_> local_48;
  
  if (targetTypes == AllTargets) {
    p_Var2 = &(mf->Targets)._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      this_00 = (cmGeneratorTarget *)operator_new(0x500);
      cmGeneratorTarget::cmGeneratorTarget(this_00,(cmTarget *)(p_Var2 + 5),lg);
      cmLocalGenerator::AddGeneratorTarget(lg,this_00);
    }
  }
  cmMakefile::GetImportedTargets((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&local_48,mf);
  for (__k = local_48._M_impl.super__Vector_impl_data._M_start;
      __k != local_48._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
    cVar1 = std::
            _Rb_tree<cmTarget_*,_std::pair<cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
            ::find(&importedMap->_M_t,__k);
    cmLocalGenerator::AddImportedGeneratorTarget(lg,(cmGeneratorTarget *)cVar1._M_node[1]._M_parent)
    ;
  }
  std::_Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(
    TargetTypes targetTypes,
    cmMakefile *mf,
    cmLocalGenerator *lg,
    std::map<cmTarget*, cmGeneratorTarget*> const& importedMap)
{
  if (targetTypes == AllTargets)
    {
    cmTargets& targets = mf->GetTargets();
    for(cmTargets::iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      cmTarget* t = &ti->second;
      cmGeneratorTarget* gt = new cmGeneratorTarget(t, lg);
      lg->AddGeneratorTarget(gt);
      }
    }

  std::vector<cmTarget*> itgts = mf->GetImportedTargets();

  for(std::vector<cmTarget*>::const_iterator
        j = itgts.begin(); j != itgts.end(); ++j)
    {
    lg->AddImportedGeneratorTarget(importedMap.find(*j)->second);
    }
}